

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

int vorbis_synthesis_headerin(vorbis_info *vi,vorbis_comment *vc,ogg_packet *op)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  char buffer [6];
  oggpack_buffer opb;
  int local_60;
  short local_5c;
  oggpack_buffer local_58;
  
  if (op != (ogg_packet *)0x0) {
    oggpack_readinit(&local_58,op->packet,(int)op->bytes);
    lVar2 = oggpack_read(&local_58,8);
    local_60 = 0;
    local_5c = 0;
    lVar4 = 0;
    do {
      lVar3 = oggpack_read(&local_58,8);
      *(char *)((long)&local_60 + lVar4) = (char)lVar3;
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 6);
    iVar1 = -0x84;
    if (local_5c == 0x7369 && local_60 == 0x62726f76) {
      iVar1 = -0x85;
      iVar5 = (int)lVar2;
      if (iVar5 == 5) {
        if ((vi->rate != 0) && (vc->vendor != (char *)0x0)) {
          if (vi->codec_setup == (void *)0x0) {
            iVar1 = -0x81;
          }
          else if (*(int *)((long)vi->codec_setup + 0x20) < 1) {
            iVar1 = _vorbis_unpack_books(vi,&local_58);
          }
        }
      }
      else if (iVar5 == 3) {
        if ((vi->rate != 0) && (vc->vendor == (char *)0x0)) {
          iVar1 = _vorbis_unpack_comment(vc,&local_58);
        }
      }
      else if (((iVar5 == 1) && (op->b_o_s != 0)) && (vi->rate == 0)) {
        iVar1 = _vorbis_unpack_info(vi,&local_58);
      }
    }
    return iVar1;
  }
  return -0x85;
}

Assistant:

int vorbis_synthesis_headerin(vorbis_info *vi,vorbis_comment *vc,ogg_packet *op){
  oggpack_buffer opb;

  if(op){
    oggpack_readinit(&opb,op->packet,op->bytes);

    /* Which of the three types of header is this? */
    /* Also verify header-ness, vorbis */
    {
      char buffer[6];
      int packtype=oggpack_read(&opb,8);
      memset(buffer,0,6);
      _v_readstring(&opb,buffer,6);
      if(memcmp(buffer,"vorbis",6)){
        /* not a vorbis header */
        return(OV_ENOTVORBIS);
      }
      switch(packtype){
      case 0x01: /* least significant *bit* is read first */
        if(!op->b_o_s){
          /* Not the initial packet */
          return(OV_EBADHEADER);
        }
        if(vi->rate!=0){
          /* previously initialized info header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_info(vi,&opb));

      case 0x03: /* least significant *bit* is read first */
        if(vi->rate==0){
          /* um... we didn't get the initial header */
          return(OV_EBADHEADER);
        }
        if(vc->vendor!=NULL){
          /* previously initialized comment header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_comment(vc,&opb));

      case 0x05: /* least significant *bit* is read first */
        if(vi->rate==0 || vc->vendor==NULL){
          /* um... we didn;t get the initial header or comments yet */
          return(OV_EBADHEADER);
        }
        if(vi->codec_setup==NULL){
          /* improperly initialized vorbis_info */
          return(OV_EFAULT);
        }
        if(((codec_setup_info *)vi->codec_setup)->books>0){
          /* previously initialized setup header */
          return(OV_EBADHEADER);
        }

        return(_vorbis_unpack_books(vi,&opb));

      default:
        /* Not a valid vorbis header type */
        return(OV_EBADHEADER);
        break;
      }
    }
  }
  return(OV_EBADHEADER);
}